

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::Arena::AddBlock(Arena *this,Block *b)

{
  size_t sVar1;
  
  internal::Mutex::Lock((Mutex *)(this + 0x30));
  b->next = *(Block **)(this + 8);
  *(Block **)(this + 8) = b;
  sVar1 = b->size;
  if (sVar1 != b->pos) {
    *(Block **)(this + 0x10) = b;
    sVar1 = b->size;
  }
  *(size_t *)(this + 0x18) = *(long *)(this + 0x18) + sVar1;
  internal::Mutex::Unlock((Mutex *)(this + 0x30));
  return;
}

Assistant:

void Arena::AddBlock(Block* b) {
  MutexLock l(&blocks_lock_);
  AddBlockInternal(b);
}